

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ConstantPaddingLayerParams::InternalSwap
          (ConstantPaddingLayerParams *this,ConstantPaddingLayerParams *other)

{
  ConstantPaddingLayerParams *other_local;
  ConstantPaddingLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->padamounts_,&other->padamounts_);
  std::swap<float>(&this->value_,&other->value_);
  std::swap<bool>(&this->padtogivenoutputsizemode_,&other->padtogivenoutputsizemode_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void ConstantPaddingLayerParams::InternalSwap(ConstantPaddingLayerParams* other) {
  padamounts_.InternalSwap(&other->padamounts_);
  std::swap(value_, other->value_);
  std::swap(padtogivenoutputsizemode_, other->padtogivenoutputsizemode_);
  std::swap(_cached_size_, other->_cached_size_);
}